

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_LU_mult(m2v *LU,int *rp,int *cp,m2v *X,m2v *Y_out)

{
  int r1;
  int alpha;
  uint uVar1;
  int i;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint r;
  int iVar5;
  long lVar6;
  
  for (iVar2 = 0; iVar2 < Y_out->n_row; iVar2 = iVar2 + 1) {
    m2v_clear_row(Y_out,iVar2);
  }
  for (lVar4 = 0; uVar1 = LU->n_row, lVar4 < LU->n_row; lVar4 = lVar4 + 1) {
    iVar2 = rp[lVar4];
    iVar5 = LU->n_col;
    for (lVar6 = (long)iVar5; iVar5 = iVar5 + -1, lVar4 < lVar6; lVar6 = lVar6 + -1) {
      r1 = cp[lVar6 + -1];
      alpha = m2v_get_el(LU,(int)lVar4,iVar5);
      m2v_multadd_row(X,r1,alpha,Y_out,iVar2);
    }
  }
  while (0 < (int)uVar1) {
    r = uVar1 - 1;
    uVar3 = LU->n_col;
    if ((int)uVar3 < (int)uVar1) {
      while (uVar1 = r, 0 < (int)uVar3) {
        uVar3 = uVar3 - 1;
        iVar2 = rp[uVar3];
        iVar5 = m2v_get_el(LU,r,uVar3);
        m2v_multadd_row(Y_out,iVar2,iVar5,Y_out,rp[r]);
      }
    }
    else {
      for (uVar3 = uVar1 - 2; uVar1 = r, -1 < (int)uVar3; uVar3 = uVar3 - 1) {
        iVar2 = rp[uVar3];
        iVar5 = m2v_get_el(LU,r,uVar3);
        m2v_multadd_row(Y_out,iVar2,iVar5,Y_out,rp[r]);
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_mult)(const MV_GEN_TYPE* LU,
		   const int* rp,
		   const int* cp,
		   const MV_GEN_TYPE* X,
		   MV_GEN_TYPE* Y_out)
{
	/* Check dimensions */
	assert(LU->n_col == X->n_row);
	assert(LU->n_row == Y_out->n_row);
	assert(X->n_col == Y_out->n_col);

	/* Clear out the rows in the target vector */
	for (int i = 0; i < Y_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(Y_out, i);
	}

	/* Multiply with U */
	for (int i = 0; i < LU->n_row; ++i) {
		const int t = rp[i];
		for (int j = LU->n_col - 1; j >= i; --j) {
			MV_GEN_N(_multadd_row)(X, cp[j],
					MV_GEN_N(_get_el)(LU, i, j),
					Y_out, t);
		}
	}

	/* Multiply with L */
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(Y_out, rp[j],
						MV_GEN_N(_get_el)(LU, i, j),
						Y_out, rp[i]);
			}
		}
	}
}